

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_port.c
# Opt level: O0

int csp_socket_close(csp_socket_t *sock)

{
  int iVar1;
  csp_socket_t *in_RDI;
  csp_packet_t *packet;
  csp_port_t *port;
  size_t i;
  void *buf;
  csp_queue_handle_t in_stack_ffffffffffffffe0;
  ulong local_18;
  
  if (in_RDI != (csp_socket_t *)0x0) {
    for (local_18 = 0; local_18 < 0x12; local_18 = local_18 + 1) {
      in_stack_ffffffffffffffe0 = (csp_queue_handle_t)(ports + local_18);
      if ((*(csp_port_state_t *)&in_stack_ffffffffffffffe0->buffer == PORT_OPEN) &&
         (ports[local_18].field_1.socket == in_RDI)) {
        *(csp_port_state_t *)&in_stack_ffffffffffffffe0->buffer = PORT_CLOSED;
        ports[local_18].field_1.socket = (csp_socket_t *)0x0;
        break;
      }
    }
    if (in_RDI->rx_queue != (csp_queue_handle_t)0x0) {
      buf = (void *)0x0;
      while (iVar1 = csp_queue_dequeue(in_stack_ffffffffffffffe0,buf,0), iVar1 == 0) {
        if (buf != (void *)0x0) {
          csp_buffer_free(in_stack_ffffffffffffffe0);
        }
      }
      csp_queue_free((csp_queue_handle_t)0x10a376);
    }
  }
  return 0;
}

Assistant:

int csp_socket_close(csp_socket_t * sock) {
	if (sock == NULL) {
		return CSP_ERR_NONE;
	}

	for (size_t i = 0; i < CSP_PORT_MAX_BIND + 2; i++) {
		csp_port_t * port = &ports[i];

		if (port->state == PORT_OPEN && port->socket == sock) {
			port->state = PORT_CLOSED;
			port->socket = NULL;
			break;
		}
	}

	if (sock->rx_queue != NULL) {
		csp_packet_t * packet = NULL;

		while (csp_queue_dequeue(sock->rx_queue, &packet, 0) == CSP_QUEUE_OK) {
			if (packet != NULL) {
				csp_buffer_free(packet);
			}
		}
		csp_queue_free(sock->rx_queue);
	}

	return CSP_ERR_NONE;
}